

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int decrypt_packet(ptls_cipher_context_t *header_protection,
                  _func_int_void_ptr_uint64_t_quicly_decoded_packet_t_ptr_size_t_size_t_ptr *aead_cb
                  ,void *aead_ctx,uint64_t *next_expected_pn,quicly_decoded_packet_t *packet,
                  uint64_t *pn,ptls_iovec_t *payload)

{
  byte bVar1;
  size_t sVar2;
  byte *pbVar3;
  bool bVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  long lVar9;
  byte bVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  size_t sVar14;
  ulong uVar15;
  uint8_t hpmask [5];
  undefined4 local_48;
  undefined1 local_44;
  void *local_40;
  size_t local_38;
  ulong uVar8;
  
  if ((packet->decrypted).pn == 0xffffffffffffffff) {
    local_44 = 0;
    local_48 = 0;
    if ((packet->octets).len - packet->encrypted_off < header_protection->algo->iv_size + 4) {
      *pn = 0xffffffffffffffff;
      iVar7 = 0xff01;
    }
    else {
      local_40 = aead_ctx;
      (*header_protection->do_init)
                (header_protection,(packet->octets).base + packet->encrypted_off + 4);
      (*header_protection->do_transform)(header_protection,&local_48,&local_48,5);
      pbVar3 = (packet->octets).base;
      bVar1 = *pbVar3;
      *pbVar3 = ((byte)~bVar1 >> 3 | 0xf) & (byte)local_48 ^ bVar1;
      lVar9 = (ulong)(*(packet->octets).base & 3) + 1;
      uVar6 = 0;
      lVar11 = 0;
      do {
        pbVar3 = (packet->octets).base + lVar11 + packet->encrypted_off;
        *pbVar3 = *pbVar3 ^ *(byte *)((long)&local_48 + lVar11 + 1);
        lVar5 = lVar11 + packet->encrypted_off;
        lVar11 = lVar11 + 1;
        uVar6 = (uint)(packet->octets).base[lVar5] | uVar6 << 8;
      } while (lVar9 != lVar11);
      sVar14 = packet->encrypted_off + lVar9;
      uVar8 = *next_expected_pn;
      uVar12 = 1L << (sbyte)((int)lVar9 << 3);
      uVar15 = (ulong)uVar6 | -uVar12 & uVar8;
      if (uVar8 < uVar15 + (uVar12 >> 1)) {
        uVar13 = uVar12;
        if (uVar15 < uVar12) {
          uVar13 = 0;
        }
        if (uVar15 <= uVar8 + (uVar12 >> 1)) {
          uVar13 = 0;
        }
        uVar12 = -uVar13;
      }
      *pn = uVar15 + uVar12;
      iVar7 = (*aead_cb)(local_40,uVar15 + uVar12,packet,sVar14,&local_38);
      if (iVar7 == 0) {
        if (*next_expected_pn <= *pn) {
          *next_expected_pn = *pn + 1;
        }
        payload->base = (packet->octets).base + sVar14;
        payload->len = local_38;
        iVar7 = 0;
      }
    }
    if (iVar7 != 0) {
      return iVar7;
    }
    goto LAB_00121d1d;
  }
  sVar14 = (packet->octets).len;
  sVar2 = packet->encrypted_off;
  payload->base = (packet->octets).base + sVar2;
  payload->len = sVar14 - sVar2;
  *pn = (packet->decrypted).pn;
  if (aead_cb == aead_decrypt_1rtt) {
    uVar8 = *(ulong *)((long)aead_ctx + 0x540);
    uVar12 = (packet->decrypted).key_phase;
    if (*(ulong *)(uVar8 + 0xb0) < uVar12) {
      uVar6 = received_key_update((quicly_conn_t *)aead_ctx,uVar12);
      uVar8 = (ulong)uVar6;
      if (uVar6 == 0) goto LAB_00121cbc;
      bVar4 = false;
    }
    else {
LAB_00121cbc:
      uVar6 = (uint)uVar8;
      bVar4 = true;
    }
    if (!bVar4) {
      return uVar6;
    }
  }
  if (*next_expected_pn < *pn) {
    *next_expected_pn = *pn + 1;
  }
LAB_00121d1d:
  bVar1 = *(packet->octets).base;
  bVar10 = 0xc;
  if (-1 < (char)bVar1) {
    bVar10 = 0x18;
  }
  iVar7 = 0x2000a;
  if ((bVar10 & bVar1) == 0) {
    iVar7 = 0x2000a;
    if (payload->len != 0) {
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

static int decrypt_packet(ptls_cipher_context_t *header_protection,
                          int (*aead_cb)(void *, uint64_t, quicly_decoded_packet_t *, size_t, size_t *), void *aead_ctx,
                          uint64_t *next_expected_pn, quicly_decoded_packet_t *packet, uint64_t *pn, ptls_iovec_t *payload)
{
    int ret;

    /* decrypt ourselves, or use the pre-decrypted input */
    if (packet->decrypted.pn == UINT64_MAX) {
        if ((ret = do_decrypt_packet(header_protection, aead_cb, aead_ctx, next_expected_pn, packet, pn, payload)) != 0)
            return ret;
    } else {
        *payload = ptls_iovec_init(packet->octets.base + packet->encrypted_off, packet->octets.len - packet->encrypted_off);
        *pn = packet->decrypted.pn;
        if (aead_cb == aead_decrypt_1rtt) {
            quicly_conn_t *conn = aead_ctx;
            if (conn->application->cipher.ingress.key_phase.decrypted < packet->decrypted.key_phase) {
                if ((ret = received_key_update(conn, packet->decrypted.key_phase)) != 0)
                    return ret;
            }
        }
        if (*next_expected_pn < *pn)
            *next_expected_pn = *pn + 1;
    }

    /* check reserved bits after AEAD decryption */
    if ((packet->octets.base[0] & (QUICLY_PACKET_IS_LONG_HEADER(packet->octets.base[0]) ? QUICLY_LONG_HEADER_RESERVED_BITS
                                                                                        : QUICLY_SHORT_HEADER_RESERVED_BITS)) !=
        0) {
        if (QUICLY_DEBUG)
            fprintf(stderr, "%s: non-zero reserved bits (pn: %" PRIu64 ")\n", __FUNCTION__, *pn);
        return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;
    }
    if (payload->len == 0) {
        if (QUICLY_DEBUG)
            fprintf(stderr, "%s: payload length is zero (pn: %" PRIu64 ")\n", __FUNCTION__, *pn);
        return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;
    }

    if (QUICLY_DEBUG) {
        char *payload_hex = quicly_hexdump(payload->base, payload->len, 4);
        fprintf(stderr, "%s: AEAD payload:\n%s", __FUNCTION__, payload_hex);
        free(payload_hex);
    }

    return 0;
}